

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask15_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  undefined1 auVar4 [16];
  long in_RAX;
  long unaff_RBX;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  vpmovsxbd_avx(ZEXT416(0x20181008));
  vpmovsxbd_avx(ZEXT416(0x1c140c04));
  uVar1 = in[0xc];
  auVar5 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + in_RAX));
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBX));
  auVar4 = vpsllvd_avx2(auVar6,_DAT_00190290);
  auVar8 = vpsllvd_avx2(auVar5,_DAT_0019c770);
  auVar6 = vpshufd_avx(auVar5,0xe9);
  auVar7 = vpsrlvd_avx2(auVar6,_DAT_00192510);
  auVar6 = vpinsrd_avx(ZEXT416(*in),auVar5._0_4_ >> 2,1);
  auVar6 = vpunpcklqdq_avx(auVar6,auVar7);
  auVar7 = vpternlogd_avx512vl(auVar8,auVar4,auVar6,0xfe);
  uVar2 = in[9];
  auVar6 = vpshufd_avx(auVar5,0xff);
  auVar6 = vpinsrd_avx(auVar6,in[10],1);
  uVar3 = in[0xd];
  auVar4 = vpinsrd_avx(ZEXT416(in[10]),uVar1,1);
  auVar8 = vpsrlvd_avx2(auVar6,_DAT_0019c780);
  auVar4 = vpsllvd_avx2(auVar4,_DAT_00191ba0);
  *(undefined1 (*) [16])out = auVar7;
  auVar6 = vpinsrd_avx(ZEXT416(uVar2),in[0xb],1);
  auVar6 = vpsllvd_avx2(auVar6,_DAT_0019ccd0);
  auVar8 = vpternlogd_avx512vl(auVar4,auVar6,auVar8,0xfe);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(in + 0xe);
  auVar4 = vpsllvd_avx2(auVar6,_DAT_0019cce0);
  auVar6 = vpinsrd_avx(ZEXT416(uVar3 << 3 | uVar1 >> 0xc),
                       (uint)(*(ulong *)(in + 0xe) >> 0xe) & 0x3ffff,1);
  *(long *)(out + 4) = auVar8._0_8_;
  auVar6 = vpor_avx(auVar4,auVar6);
  *(long *)(out + 6) = auVar6._0_8_;
  return out + 8;
}

Assistant:

uint32_t *__fastpackwithoutmask15_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (15 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (15 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (15 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (15 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (15 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (15 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (15 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;

  return out + 1;
}